

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O2

Grammar * __thiscall
xercesc_4_0::GrammarResolver::orphanGrammar(GrammarResolver *this,XMLCh *nameSpaceKey)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Grammar *pGVar3;
  
  if (this->fCacheGrammar == true) {
    iVar2 = (*this->fGrammarPool->_vptr_XMLGrammarPool[4])(this->fGrammarPool,nameSpaceKey);
    pGVar3 = (Grammar *)CONCAT44(extraout_var,iVar2);
    if (pGVar3 == (Grammar *)0x0) {
      bVar1 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::containsKey
                        (this->fGrammarBucket,nameSpaceKey);
      if (bVar1) goto LAB_002e5f41;
      pGVar3 = (Grammar *)0x0;
    }
    else {
      bVar1 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::containsKey
                        (this->fGrammarFromPool,nameSpaceKey);
      if (bVar1) {
        RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::removeKey
                  (this->fGrammarFromPool,nameSpaceKey);
      }
    }
    return pGVar3;
  }
LAB_002e5f41:
  pGVar3 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::orphanKey
                     (this->fGrammarBucket,nameSpaceKey);
  return pGVar3;
}

Assistant:

Grammar* GrammarResolver::orphanGrammar(const XMLCh* const nameSpaceKey)
{
    if (fCacheGrammar)
    {
        Grammar* grammar = fGrammarPool->orphanGrammar(nameSpaceKey);
        if (grammar)
        {
            if (fGrammarFromPool->containsKey(nameSpaceKey))
                fGrammarFromPool->removeKey(nameSpaceKey);
        }
        // Check to see if it's in fGrammarBucket, since
        // we put it there if the grammar pool refused to
        // cache it.
        else if (fGrammarBucket->containsKey(nameSpaceKey))
        {
            grammar = fGrammarBucket->orphanKey(nameSpaceKey);
        }

        return grammar;
    }
    else
    {
        return fGrammarBucket->orphanKey(nameSpaceKey);
    }
}